

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::FillTVaR
          (aggreports *this,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,int summary_id,int sidx,double nextreturnperiod_value,OASIS_FLOAT tvar)

{
  mapped_type *this_00;
  wheatkey wk;
  key_type local_18;
  TVaR local_10;
  
  local_18.summary_id = summary_id;
  local_18.sidx = sidx;
  this_00 = std::
            map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
            ::operator[](tail,&local_18);
  local_10.retperiod = nextreturnperiod_value;
  local_10.tvar = tvar;
  std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,&local_10);
  return;
}

Assistant:

void aggreports::FillTVaR(std::map<wheatkey, std::vector<TVaR>> &tail,
			  const int summary_id, const int sidx,
			  const double nextreturnperiod_value,
			  const OASIS_FLOAT tvar) {

  wheatkey wk;
  wk.summary_id = summary_id;
  wk.sidx = sidx;
  tail[wk].push_back({nextreturnperiod_value, tvar});

}